

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

int Gia_RsbCost(Gia_RsbMan_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int local_30;
  int local_2c;
  int Cost;
  int i;
  Vec_Int_t *vLevel [2];
  Gia_RsbMan_t *p_local;
  
  local_30 = 0;
  for (local_2c = 0; iVar1 = Vec_WecSize(p->vSets[0]), local_2c < iVar1; local_2c = local_2c + 1) {
    p_00 = Vec_WecEntry(p->vSets[0],local_2c);
    p_01 = Vec_WecEntry(p->vSets[1],local_2c);
    iVar1 = Vec_IntSize(p_00);
    iVar2 = Vec_IntSize(p_01);
    local_30 = iVar1 * iVar2 + local_30;
  }
  return local_30;
}

Assistant:

int Gia_RsbCost( Gia_RsbMan_t * p )
{
    Vec_Int_t * vLevel[2]; int i, Cost = 0;
    Vec_WecForEachLevelTwo( p->vSets[0], p->vSets[1], vLevel[0], vLevel[1], i )
        Cost += Vec_IntSize(vLevel[0]) * Vec_IntSize(vLevel[1]);
    return Cost;
}